

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteSourceProperty
          (cmGhsMultiTargetGenerator *this,ostream *fout,cmSourceFile *sf,string *propName,
          string *propFlag)

{
  pointer pcVar1;
  pointer pbVar2;
  cmValue cVar3;
  ostream *poVar4;
  string *p;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmList list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  cmList local_48;
  
  cVar3 = cmSourceFile::GetProperty(sf,propName);
  if (cVar3.Value != (string *)0x0) {
    pcVar1 = ((cVar3.Value)->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (cVar3.Value)->_M_string_length);
    init._M_len = 1;
    init._M_array = &local_68;
    cmList::cmList(&local_48,init);
    pbVar2 = local_48.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      pbVar2 = local_48.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; pbVar2 != local_48.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>(fout,"    ",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (fout,(propFlag->_M_dataplus)._M_p,propFlag->_M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
      local_68._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_68,1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48.Values);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSourceProperty(
  std::ostream& fout, const cmSourceFile* sf, std::string const& propName,
  std::string const& propFlag)
{
  cmValue prop = sf->GetProperty(propName);
  if (prop) {
    cmList list{ *prop };
    for (const std::string& p : list) {
      fout << "    " << propFlag << p << '\n';
    }
  }
}